

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::getPrefixMultiplier(char p)

{
  double dStack_10;
  char p_local;
  
  switch(p) {
  case 'A':
  case 'a':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::atto);
    break;
  case 'B':
  case 'G':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::giga);
    break;
  case 'C':
  case 'c':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::centi);
    break;
  case 'D':
  case 'd':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::deci);
    break;
  case 'E':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::exa);
    break;
  case 'F':
  case 'f':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::femto);
    break;
  case 'H':
  case 'h':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::hecto);
    break;
  case 'K':
  case 'k':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::kilo);
    break;
  case 'M':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::mega);
    break;
  case 'P':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::peta);
    break;
  case 'Q':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::quetta);
    break;
  case 'R':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::ronna);
    break;
  case 'T':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::tera);
    break;
  case 'Y':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::yotta);
    break;
  case 'Z':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::zetta);
    break;
  case 'm':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::milli);
    break;
  case 'n':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::nano);
    break;
  case 'p':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::pico);
    break;
  case 'q':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::quecto);
    break;
  case 'r':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::ronto);
    break;
  case 'y':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::yocto);
    break;
  case 'z':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::zepto);
    break;
  case -0xffffff4b:
  case 'U':
  case 'u':
    dStack_10 = precise_unit::multiplier((precise_unit *)precise::micro);
    break;
  default:
    dStack_10 = 0.0;
  }
  return dStack_10;
}

Assistant:

static double getPrefixMultiplier(char p)
{
    switch (p) {
        case 'm':
            return precise::milli.multiplier();
        case 'k':
        case 'K':
            return precise::kilo.multiplier();
        case 'M':
            return precise::mega.multiplier();
        case 'u':
        case 'U':
        case '\xB5':  // latin-1 encoding "micro"
            return precise::micro.multiplier();
        case 'd':
        case 'D':
            return precise::deci.multiplier();
        case 'c':
        case 'C':
            return precise::centi.multiplier();
        case 'h':
        case 'H':
            return precise::hecto.multiplier();
        case 'n':
            return precise::nano.multiplier();
        case 'p':
            return precise::pico.multiplier();
        case 'G':
        case 'B':  // Billion
            return precise::giga.multiplier();
        case 'T':
            return precise::tera.multiplier();
        case 'f':
        case 'F':
            return precise::femto.multiplier();
        case 'E':
            return precise::exa.multiplier();
        case 'P':
            return precise::peta.multiplier();
        case 'Z':
            return precise::zetta.multiplier();
        case 'Y':
            return precise::yotta.multiplier();
        case 'y':
            return precise::yocto.multiplier();
        case 'a':
        case 'A':
            return precise::atto.multiplier();
        case 'z':
            return precise::zepto.multiplier();
        case 'R':
            return precise::ronna.multiplier();
        case 'r':
            return precise::ronto.multiplier();
        case 'Q':
            return precise::quetta.multiplier();
        case 'q':
            return precise::quecto.multiplier();
        default:
            return 0.0;
    }
}